

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall OSSLRSA::signFinal(OSSLRSA *this,ByteString *signature)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  RSA *rsa_00;
  RSA *pRVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  ByteString em;
  int result;
  bool rv;
  RSA *rsa;
  uint sigLen;
  EVP_MD *hash;
  bool isPSS;
  int type;
  ByteString digest;
  bool bSecondResult;
  bool bFirstResult;
  ByteString secondHash;
  ByteString firstHash;
  Type mechanism;
  OSSLRSAPrivateKey *pk;
  ulong in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  ByteString *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  byte local_113;
  bool local_d9;
  uint local_cc;
  EVP_MD *local_c8;
  byte local_bd;
  int local_bc;
  undefined4 local_8c;
  byte local_86;
  byte local_85;
  undefined1 local_78 [40];
  undefined1 local_50 [44];
  Type local_24;
  PrivateKey *local_20;
  bool local_1;
  
  local_20 = in_RDI->currentPrivateKey;
  local_24 = in_RDI->currentMechanism;
  bVar2 = AsymmetricAlgorithm::signFinal(in_RDI,in_RSI);
  if (bVar2) {
    ByteString::ByteString((ByteString *)0x136908);
    ByteString::ByteString((ByteString *)0x136915);
    local_85 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x20))
                         (in_RDI[1]._vptr_AsymmetricAlgorithm,local_50);
    local_85 = local_85 & 1;
    if (in_RDI[1].currentPublicKey == (PublicKey *)0x0) {
      local_113 = 1;
    }
    else {
      iVar3 = (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[4])
                        (in_RDI[1].currentPublicKey,local_78);
      local_113 = (byte)iVar3;
    }
    local_86 = local_113 & 1;
    if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
      (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
    }
    in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
      if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
        (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[1])();
      }
      in_RDI[1].currentPublicKey = (PublicKey *)0x0;
    }
    if (((local_85 & 1) == 0) || ((local_86 & 1) == 0)) {
      local_1 = false;
      local_8c = 1;
    }
    else {
      operator+((ByteString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                in_stack_fffffffffffffdf0);
      (*(local_20->super_Serialisable)._vptr_Serialisable[0x16])();
      ByteString::size((ByteString *)0x136ae0);
      ByteString::resize((ByteString *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                         ,in_stack_fffffffffffffdc8);
      local_bc = 0;
      local_bd = 0;
      local_c8 = (EVP_MD *)0x0;
      switch(local_24) {
      case RSA_MD5_PKCS:
        local_bc = 4;
        break;
      default:
        break;
      case RSA_SHA1_PKCS:
        local_bc = 0x40;
        break;
      case RSA_SHA224_PKCS:
        local_bc = 0x2a3;
        break;
      case RSA_SHA256_PKCS:
        local_bc = 0x2a0;
        break;
      case RSA_SHA384_PKCS:
        local_bc = 0x2a1;
        break;
      case RSA_SHA512_PKCS:
        local_bc = 0x2a2;
        break;
      case RSA_SHA1_PKCS_PSS:
        local_bd = 1;
        local_c8 = EVP_sha1();
        break;
      case RSA_SHA224_PKCS_PSS:
        local_bd = 1;
        local_c8 = EVP_sha224();
        break;
      case RSA_SHA256_PKCS_PSS:
        local_bd = 1;
        local_c8 = EVP_sha256();
        break;
      case RSA_SHA384_PKCS_PSS:
        local_bd = 1;
        local_c8 = EVP_sha384();
        break;
      case RSA_SHA512_PKCS_PSS:
        local_bd = 1;
        local_c8 = EVP_sha512();
        break;
      case RSA_SSL:
        local_bc = 0x72;
      }
      sVar5 = ByteString::size((ByteString *)0x136cbd);
      local_cc = (uint)sVar5;
      rsa_00 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                ((OSSLRSAPrivateKey *)
                                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      iVar3 = RSA_blinding_on(rsa_00,(BN_CTX *)0x0);
      if (iVar3 == 0) {
        softHSMLog(3,"signFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x269,"Failed to turn blinding on for OpenSSL RSA key");
        local_1 = false;
      }
      else {
        if ((local_bd & 1) == 0) {
          iVar3 = local_bc;
          puVar7 = ByteString::operator[]
                             ((ByteString *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              in_stack_fffffffffffffdc8);
          sVar5 = ByteString::size((ByteString *)0x137019);
          puVar8 = ByteString::operator[]
                             ((ByteString *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              in_stack_fffffffffffffdc8);
          pRVar6 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                    ((OSSLRSAPrivateKey *)
                                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          in_stack_fffffffffffffdd4 = RSA_sign(iVar3,puVar7,(uint)sVar5,puVar8,&local_cc,pRVar6);
          local_d9 = in_stack_fffffffffffffdd4 < 1;
          if (local_d9) {
            in_stack_fffffffffffffdc8 = ERR_get_error();
            softHSMLog(3,"signFinal",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x297,"RSA sign failed (0x%08X)",in_stack_fffffffffffffdc8);
          }
          local_d9 = !local_d9;
        }
        else {
          ByteString::ByteString((ByteString *)0x136d7e);
          (*(local_20->super_Serialisable)._vptr_Serialisable[0x16])();
          ByteString::size((ByteString *)0x136dab);
          ByteString::resize((ByteString *)
                             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                             in_stack_fffffffffffffdc8);
          pRVar6 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                    ((OSSLRSAPrivateKey *)
                                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          puVar7 = ByteString::operator[]
                             ((ByteString *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              in_stack_fffffffffffffdc8);
          puVar8 = ByteString::operator[]
                             ((ByteString *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              in_stack_fffffffffffffdc8);
          iVar3 = RSA_padding_add_PKCS1_PSS
                            (pRVar6,puVar7,puVar8,local_c8,*(int *)&in_RDI[1].currentPrivateKey);
          if (iVar3 == 1) {
            sVar5 = ByteString::size((ByteString *)0x136eef);
            puVar7 = ByteString::operator[]
                               ((ByteString *)
                                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                in_stack_fffffffffffffdc8);
            puVar8 = ByteString::operator[]
                               ((ByteString *)
                                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                in_stack_fffffffffffffdc8);
            pRVar6 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                      ((OSSLRSAPrivateKey *)
                                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0)
                                      );
            uVar4 = RSA_private_encrypt((int)sVar5,puVar7,puVar8,pRVar6,3);
            uVar1 = uVar4;
            if ((int)uVar4 < 0) {
              uVar9 = ERR_get_error();
              softHSMLog(3,"signFinal",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                         ,0x288,"RSA private encrypt failed (0x%08X)",uVar9);
              uVar1 = local_cc;
            }
            local_cc = uVar1;
            local_d9 = (int)uVar4 >= 0;
          }
          else {
            uVar9 = ERR_get_error();
            softHSMLog(3,"signFinal",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x27a,"RSA PSS padding failed (0x%08X)",uVar9);
            local_d9 = false;
          }
          ByteString::~ByteString((ByteString *)0x136fe4);
        }
        RSA_blinding_off(rsa_00);
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                           in_stack_fffffffffffffdc8);
        local_1 = local_d9;
      }
      local_8c = 1;
      ByteString::~ByteString((ByteString *)0x13712e);
    }
    ByteString::~ByteString((ByteString *)0x13714c);
    ByteString::~ByteString((ByteString *)0x137159);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLRSA::signFinal(ByteString& signature)
{
	// Save necessary state before calling super class signFinal
	OSSLRSAPrivateKey* pk = (OSSLRSAPrivateKey*) currentPrivateKey;
	AsymMech::Type mechanism = currentMechanism;

	if (!AsymmetricAlgorithm::signFinal(signature))
	{
		return false;
	}

	ByteString firstHash, secondHash;

	bool bFirstResult = pCurrentHash->hashFinal(firstHash);
	bool bSecondResult = (pSecondHash != NULL) ? pSecondHash->hashFinal(secondHash) : true;

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (pSecondHash != NULL)
	{
		delete pSecondHash;

		pSecondHash = NULL;
	}

	if (!bFirstResult || !bSecondResult)
	{
		return false;
	}

	ByteString digest = firstHash + secondHash;

	// Resize the data block for the signature to the modulus size of the key
	signature.resize(pk->getN().size());

	// Determine the signature NID type
	int type = 0;
	bool isPSS = false;
	const EVP_MD* hash = NULL;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			type = NID_md5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			type = NID_sha1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			type = NID_sha224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			type = NID_sha256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			type = NID_sha384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			type = NID_sha512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha1();
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha224();
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha256();
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha384();
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha512();
			break;
		case AsymMech::RSA_SSL:
			type = NID_md5_sha1;
			break;
		default:
			break;
	}

	// Perform the signature operation
	unsigned int sigLen = signature.size();

	RSA* rsa = pk->getOSSLKey();

	if (!RSA_blinding_on(rsa, NULL))
	{
		ERROR_MSG("Failed to turn blinding on for OpenSSL RSA key");

		return false;
	}

	bool rv;
	int result;

	if (isPSS)
	{
		ByteString em;
		em.resize(pk->getN().size());

		result = (RSA_padding_add_PKCS1_PSS(pk->getOSSLKey(), &em[0], &digest[0],
						hash, sLen) == 1);
		if (!result)
		{
			ERROR_MSG("RSA PSS padding failed (0x%08X)", ERR_get_error());
			rv = false;
		}
		else
		{
			result = RSA_private_encrypt(em.size(), &em[0], &signature[0],
							 pk->getOSSLKey(), RSA_NO_PADDING);
			if (result >= 0)
			{
				sigLen = result;
				rv = true;
			}
			else
			{
				ERROR_MSG("RSA private encrypt failed (0x%08X)", ERR_get_error());
				rv = false;
			}
		}
	}
	else
	{
		result = RSA_sign(type, &digest[0], digest.size(), &signature[0],
			       &sigLen, pk->getOSSLKey());
		if (result > 0)
		{
			rv = true;
		}
		else
		{
			ERROR_MSG("RSA sign failed (0x%08X)", ERR_get_error());
			rv = false;
		}
	}

	RSA_blinding_off(rsa);

	signature.resize(sigLen);

	return rv;
}